

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O3

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,BinaryExpression *binary_exp,void *data)

{
  int iVar1;
  SyntaxTree *pSVar2;
  undefined4 uVar3;
  SemanticException *this_00;
  uint uVar4;
  TokenDetail *t;
  ExpVarData r_exp_var_data;
  ExpVarData l_exp_var_data;
  undefined8 local_38;
  undefined1 local_30;
  undefined8 local_2c;
  undefined1 local_24;
  
  local_2c = 1;
  local_24 = 0;
  local_38 = 1;
  local_30 = 0;
  pSVar2 = (binary_exp->left_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  pSVar2 = (binary_exp->right_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,&local_38);
  iVar1 = (binary_exp->op_token_).token_;
  t = &binary_exp->op_token_;
  uVar3 = 2;
  if (iVar1 < 0x118) {
    uVar4 = iVar1 - 0x25;
    if (0x39 < uVar4) {
      return;
    }
    if ((0x200000000000561U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
      if ((local_2c._4_4_ == 0) || (local_2c._4_4_ == 3)) {
        uVar3 = 3;
        if ((local_38._4_4_ == 0) || (local_38._4_4_ == 3)) goto LAB_00130db9;
        this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
        SemanticException::SemanticException
                  (this_00,"right expression of binary operator is not number",t);
      }
      else {
        this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
        SemanticException::SemanticException
                  (this_00,"left expression of binary operator is not number",t);
      }
      goto LAB_00130e2a;
    }
    if ((0x2800000UL >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      return;
    }
  }
  else {
    if (iVar1 - 0x118U < 2) goto LAB_00130db9;
    if (1 < iVar1 - 0x11aU) {
      if (iVar1 != 0x11c) {
        return;
      }
      uVar3 = 4;
      if (local_38._4_4_ != 0 && local_2c._4_4_ != 0) {
        if ((local_2c._4_4_ != 4 || 1 < local_38._4_4_ - 3U) &&
           (local_2c._4_4_ != 3 || local_38._4_4_ != 4)) {
          this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
          SemanticException::SemanticException(this_00,"can not concat operands",t);
          goto LAB_00130e2a;
        }
      }
      goto LAB_00130db9;
    }
  }
  if (local_38._4_4_ == 0 || local_2c._4_4_ == 0) {
LAB_00130db9:
    *(undefined4 *)((long)data + 4) = uVar3;
    return;
  }
  if (local_2c._4_4_ == local_38._4_4_) {
    if (0xfffffffd < local_2c._4_4_ - 5U) goto LAB_00130db9;
    this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
    SemanticException::SemanticException(this_00,"can not compare operands",t);
  }
  else {
    this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
    SemanticException::SemanticException(this_00,"compare different expression type",t);
  }
LAB_00130e2a:
  __cxa_throw(this_00,&SemanticException::typeinfo,Exception::~Exception);
}

Assistant:

void SemanticAnalysisVisitor::Visit(BinaryExpression *binary_exp, void *data)
    {
        // Binary expression is read semantic
        ExpVarData l_exp_var_data{ SemanticOp_Read };
        ExpVarData r_exp_var_data{ SemanticOp_Read };
        binary_exp->left_->Accept(this, &l_exp_var_data);
        binary_exp->right_->Accept(this, &r_exp_var_data);

        auto parent_exp_var_data = static_cast<ExpVarData *>(data);
        switch (binary_exp->op_token_.token_)
        {
            case '+': case '-': case '*': case '/': case '^': case '%':
                if (l_exp_var_data.exp_type_ != ExpType_Unknown &&
                    l_exp_var_data.exp_type_ != ExpType_Number)
                    throw SemanticException("left expression of binary operator is not number",
                                            binary_exp->op_token_);
                if (r_exp_var_data.exp_type_ != ExpType_Unknown &&
                    r_exp_var_data.exp_type_ != ExpType_Number)
                    throw SemanticException("right expression of binary operator is not number",
                                            binary_exp->op_token_);
                parent_exp_var_data->exp_type_ = ExpType_Number;
                break;
            case '<': case '>': case Token_LessEqual: case Token_GreaterEqual:
                if (l_exp_var_data.exp_type_ != ExpType_Unknown &&
                    r_exp_var_data.exp_type_ != ExpType_Unknown)
                {
                    if (l_exp_var_data.exp_type_ != r_exp_var_data.exp_type_)
                        throw SemanticException("compare different expression type",
                                                binary_exp->op_token_);
                    else if (l_exp_var_data.exp_type_ != ExpType_Number &&
                             l_exp_var_data.exp_type_ != ExpType_String)
                        throw SemanticException("can not compare operands",
                                                binary_exp->op_token_);
                }
                parent_exp_var_data->exp_type_ = ExpType_Bool;
                break;
            case Token_Concat:
                if (l_exp_var_data.exp_type_ != ExpType_Unknown &&
                    r_exp_var_data.exp_type_ != ExpType_Unknown)
                {
                    if (!((l_exp_var_data.exp_type_ == ExpType_String &&
                           r_exp_var_data.exp_type_ == ExpType_String) ||
                          (l_exp_var_data.exp_type_ == ExpType_String &&
                           r_exp_var_data.exp_type_ == ExpType_Number) ||
                          (l_exp_var_data.exp_type_ == ExpType_Number &&
                           r_exp_var_data.exp_type_ == ExpType_String)))
                        throw SemanticException("can not concat operands",
                                                binary_exp->op_token_);
                }
                parent_exp_var_data->exp_type_ = ExpType_String;
                break;
            case Token_NotEqual: case Token_Equal:
                parent_exp_var_data->exp_type_ = ExpType_Bool;
                break;
            case Token_And: case Token_Or:
                break;
            default:
                break;
        }
    }